

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# intrusive_set_column.h
# Opt level: O2

void __thiscall
Gudhi::persistence_matrix::
Intrusive_set_column<Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)8,_false,_false,_false>_>_>
::Intrusive_set_column
          (Intrusive_set_column<Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)8,_false,_false,_false>_>_>
           *this,Intrusive_set_column<Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)8,_false,_false,_false>_>_>
                 *column,Column_settings *colSettings)

{
  Column_support *this_00;
  ID_index IVar1;
  Field_operators *pFVar2;
  
  IVar1 = (column->super_Chain_column_option).pivot_;
  this->super_Column_dimension_option =
       (Column_dimension_option)(column->super_Column_dimension_option).dim_;
  (this->super_Chain_column_option).pivot_ = IVar1;
  (this->super_Chain_column_option).pairedColumn_ =
       (column->super_Chain_column_option).pairedColumn_;
  this_00 = &this->column_;
  *(undefined8 *)
   &(this->column_).super_type.
    super_bstree_impl<boost::intrusive::bhtraits<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)8,_false,_false,_false>_>_>,_boost::intrusive::rbtree_node_traits<void_*,_false>,_(boost::intrusive::link_mode_type)1,_Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)8,_false,_false,_false>_>::Matrix_column_tag,_3U>,_void,_void,_unsigned_long,_false,_(boost::intrusive::algo_types)5,_void>
    .
    super_bstbase<boost::intrusive::bhtraits<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)8,_false,_false,_false>_>_>,_boost::intrusive::rbtree_node_traits<void_*,_false>,_(boost::intrusive::link_mode_type)1,_Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)8,_false,_false,_false>_>::Matrix_column_tag,_3U>,_void,_void,_false,_unsigned_long,_(boost::intrusive::algo_types)5,_void>
    .
    super_bstbase_hack<boost::intrusive::bhtraits<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)8,_false,_false,_false>_>_>,_boost::intrusive::rbtree_node_traits<void_*,_false>,_(boost::intrusive::link_mode_type)1,_Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)8,_false,_false,_false>_>::Matrix_column_tag,_3U>,_void,_void,_false,_unsigned_long,_(boost::intrusive::algo_types)5,_void>
    .
    super_bstbase2<boost::intrusive::bhtraits<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)8,_false,_false,_false>_>_>,_boost::intrusive::rbtree_node_traits<void_*,_false>,_(boost::intrusive::link_mode_type)1,_Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)8,_false,_false,_false>_>::Matrix_column_tag,_3U>,_void,_void,_(boost::intrusive::algo_types)5,_void>
    .
    super_bstbase3<boost::intrusive::bhtraits<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)8,_false,_false,_false>_>_>,_boost::intrusive::rbtree_node_traits<void_*,_false>,_(boost::intrusive::link_mode_type)1,_Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)8,_false,_false,_false>_>::Matrix_column_tag,_3U>,_(boost::intrusive::algo_types)5,_void>
    .holder = 0;
  *(node_ptr *)
   ((long)&(this->column_).super_type.
           super_bstree_impl<boost::intrusive::bhtraits<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)8,_false,_false,_false>_>_>,_boost::intrusive::rbtree_node_traits<void_*,_false>,_(boost::intrusive::link_mode_type)1,_Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)8,_false,_false,_false>_>::Matrix_column_tag,_3U>,_void,_void,_unsigned_long,_false,_(boost::intrusive::algo_types)5,_void>
           .
           super_bstbase<boost::intrusive::bhtraits<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)8,_false,_false,_false>_>_>,_boost::intrusive::rbtree_node_traits<void_*,_false>,_(boost::intrusive::link_mode_type)1,_Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)8,_false,_false,_false>_>::Matrix_column_tag,_3U>,_void,_void,_false,_unsigned_long,_(boost::intrusive::algo_types)5,_void>
           .
           super_bstbase_hack<boost::intrusive::bhtraits<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)8,_false,_false,_false>_>_>,_boost::intrusive::rbtree_node_traits<void_*,_false>,_(boost::intrusive::link_mode_type)1,_Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)8,_false,_false,_false>_>::Matrix_column_tag,_3U>,_void,_void,_false,_unsigned_long,_(boost::intrusive::algo_types)5,_void>
           .
           super_bstbase2<boost::intrusive::bhtraits<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)8,_false,_false,_false>_>_>,_boost::intrusive::rbtree_node_traits<void_*,_false>,_(boost::intrusive::link_mode_type)1,_Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)8,_false,_false,_false>_>::Matrix_column_tag,_3U>,_void,_void,_(boost::intrusive::algo_types)5,_void>
           .
           super_bstbase3<boost::intrusive::bhtraits<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)8,_false,_false,_false>_>_>,_boost::intrusive::rbtree_node_traits<void_*,_false>,_(boost::intrusive::link_mode_type)1,_Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)8,_false,_false,_false>_>::Matrix_column_tag,_3U>,_(boost::intrusive::algo_types)5,_void>
   + 8) = (node_ptr)0x0;
  *(node_ptr *)
   ((long)&(this->column_).super_type.
           super_bstree_impl<boost::intrusive::bhtraits<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)8,_false,_false,_false>_>_>,_boost::intrusive::rbtree_node_traits<void_*,_false>,_(boost::intrusive::link_mode_type)1,_Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)8,_false,_false,_false>_>::Matrix_column_tag,_3U>,_void,_void,_unsigned_long,_false,_(boost::intrusive::algo_types)5,_void>
           .
           super_bstbase<boost::intrusive::bhtraits<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)8,_false,_false,_false>_>_>,_boost::intrusive::rbtree_node_traits<void_*,_false>,_(boost::intrusive::link_mode_type)1,_Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)8,_false,_false,_false>_>::Matrix_column_tag,_3U>,_void,_void,_false,_unsigned_long,_(boost::intrusive::algo_types)5,_void>
           .
           super_bstbase_hack<boost::intrusive::bhtraits<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)8,_false,_false,_false>_>_>,_boost::intrusive::rbtree_node_traits<void_*,_false>,_(boost::intrusive::link_mode_type)1,_Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)8,_false,_false,_false>_>::Matrix_column_tag,_3U>,_void,_void,_false,_unsigned_long,_(boost::intrusive::algo_types)5,_void>
           .
           super_bstbase2<boost::intrusive::bhtraits<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)8,_false,_false,_false>_>_>,_boost::intrusive::rbtree_node_traits<void_*,_false>,_(boost::intrusive::link_mode_type)1,_Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)8,_false,_false,_false>_>::Matrix_column_tag,_3U>,_void,_void,_(boost::intrusive::algo_types)5,_void>
           .
           super_bstbase3<boost::intrusive::bhtraits<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)8,_false,_false,_false>_>_>,_boost::intrusive::rbtree_node_traits<void_*,_false>,_(boost::intrusive::link_mode_type)1,_Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)8,_false,_false,_false>_>::Matrix_column_tag,_3U>,_(boost::intrusive::algo_types)5,_void>
   + 0x10) = (node_ptr)0x0;
  *(undefined8 *)
   ((long)&(this->column_).super_type.
           super_bstree_impl<boost::intrusive::bhtraits<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)8,_false,_false,_false>_>_>,_boost::intrusive::rbtree_node_traits<void_*,_false>,_(boost::intrusive::link_mode_type)1,_Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)8,_false,_false,_false>_>::Matrix_column_tag,_3U>,_void,_void,_unsigned_long,_false,_(boost::intrusive::algo_types)5,_void>
           .
           super_bstbase<boost::intrusive::bhtraits<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)8,_false,_false,_false>_>_>,_boost::intrusive::rbtree_node_traits<void_*,_false>,_(boost::intrusive::link_mode_type)1,_Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)8,_false,_false,_false>_>::Matrix_column_tag,_3U>,_void,_void,_false,_unsigned_long,_(boost::intrusive::algo_types)5,_void>
           .
           super_bstbase_hack<boost::intrusive::bhtraits<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)8,_false,_false,_false>_>_>,_boost::intrusive::rbtree_node_traits<void_*,_false>,_(boost::intrusive::link_mode_type)1,_Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)8,_false,_false,_false>_>::Matrix_column_tag,_3U>,_void,_void,_false,_unsigned_long,_(boost::intrusive::algo_types)5,_void>
           .
           super_bstbase2<boost::intrusive::bhtraits<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)8,_false,_false,_false>_>_>,_boost::intrusive::rbtree_node_traits<void_*,_false>,_(boost::intrusive::link_mode_type)1,_Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)8,_false,_false,_false>_>::Matrix_column_tag,_3U>,_void,_void,_(boost::intrusive::algo_types)5,_void>
           .
           super_bstbase3<boost::intrusive::bhtraits<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)8,_false,_false,_false>_>_>,_boost::intrusive::rbtree_node_traits<void_*,_false>,_(boost::intrusive::link_mode_type)1,_Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)8,_false,_false,_false>_>::Matrix_column_tag,_3U>,_(boost::intrusive::algo_types)5,_void>
   + 0x18) = 0;
  *(Column_support **)
   ((long)&(this->column_).super_type.
           super_bstree_impl<boost::intrusive::bhtraits<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)8,_false,_false,_false>_>_>,_boost::intrusive::rbtree_node_traits<void_*,_false>,_(boost::intrusive::link_mode_type)1,_Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)8,_false,_false,_false>_>::Matrix_column_tag,_3U>,_void,_void,_unsigned_long,_false,_(boost::intrusive::algo_types)5,_void>
           .
           super_bstbase<boost::intrusive::bhtraits<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)8,_false,_false,_false>_>_>,_boost::intrusive::rbtree_node_traits<void_*,_false>,_(boost::intrusive::link_mode_type)1,_Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)8,_false,_false,_false>_>::Matrix_column_tag,_3U>,_void,_void,_false,_unsigned_long,_(boost::intrusive::algo_types)5,_void>
           .
           super_bstbase_hack<boost::intrusive::bhtraits<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)8,_false,_false,_false>_>_>,_boost::intrusive::rbtree_node_traits<void_*,_false>,_(boost::intrusive::link_mode_type)1,_Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)8,_false,_false,_false>_>::Matrix_column_tag,_3U>,_void,_void,_false,_unsigned_long,_(boost::intrusive::algo_types)5,_void>
           .
           super_bstbase2<boost::intrusive::bhtraits<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)8,_false,_false,_false>_>_>,_boost::intrusive::rbtree_node_traits<void_*,_false>,_(boost::intrusive::link_mode_type)1,_Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)8,_false,_false,_false>_>::Matrix_column_tag,_3U>,_void,_void,_(boost::intrusive::algo_types)5,_void>
           .
           super_bstbase3<boost::intrusive::bhtraits<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)8,_false,_false,_false>_>_>,_boost::intrusive::rbtree_node_traits<void_*,_false>,_(boost::intrusive::link_mode_type)1,_Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)8,_false,_false,_false>_>::Matrix_column_tag,_3U>,_(boost::intrusive::algo_types)5,_void>
   + 8) = this_00;
  *(Column_support **)
   ((long)&(this->column_).super_type.
           super_bstree_impl<boost::intrusive::bhtraits<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)8,_false,_false,_false>_>_>,_boost::intrusive::rbtree_node_traits<void_*,_false>,_(boost::intrusive::link_mode_type)1,_Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)8,_false,_false,_false>_>::Matrix_column_tag,_3U>,_void,_void,_unsigned_long,_false,_(boost::intrusive::algo_types)5,_void>
           .
           super_bstbase<boost::intrusive::bhtraits<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)8,_false,_false,_false>_>_>,_boost::intrusive::rbtree_node_traits<void_*,_false>,_(boost::intrusive::link_mode_type)1,_Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)8,_false,_false,_false>_>::Matrix_column_tag,_3U>,_void,_void,_false,_unsigned_long,_(boost::intrusive::algo_types)5,_void>
           .
           super_bstbase_hack<boost::intrusive::bhtraits<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)8,_false,_false,_false>_>_>,_boost::intrusive::rbtree_node_traits<void_*,_false>,_(boost::intrusive::link_mode_type)1,_Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)8,_false,_false,_false>_>::Matrix_column_tag,_3U>,_void,_void,_false,_unsigned_long,_(boost::intrusive::algo_types)5,_void>
           .
           super_bstbase2<boost::intrusive::bhtraits<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)8,_false,_false,_false>_>_>,_boost::intrusive::rbtree_node_traits<void_*,_false>,_(boost::intrusive::link_mode_type)1,_Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)8,_false,_false,_false>_>::Matrix_column_tag,_3U>,_void,_void,_(boost::intrusive::algo_types)5,_void>
           .
           super_bstbase3<boost::intrusive::bhtraits<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)8,_false,_false,_false>_>_>,_boost::intrusive::rbtree_node_traits<void_*,_false>,_(boost::intrusive::link_mode_type)1,_Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)8,_false,_false,_false>_>::Matrix_column_tag,_3U>,_(boost::intrusive::algo_types)5,_void>
   + 0x10) = this_00;
  pFVar2 = (Field_operators *)0x0;
  if (colSettings == (Column_settings *)0x0) {
    pFVar2 = column->operators_;
  }
  this->operators_ = pFVar2;
  if (colSettings == (Column_settings *)0x0) {
    colSettings = (Column_settings *)column->entryPool_;
  }
  this->entryPool_ = (Entry_constructor *)colSettings;
  boost::intrusive::
  bstree_impl<boost::intrusive::bhtraits<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Chain_col_options<true,(Gudhi::persistence_matrix::Column_types)8,false,false,false>>>,boost::intrusive::rbtree_node_traits<void*,false>,(boost::intrusive::link_mode_type)1,Column_mini_matrix<Chain_col_options<true,(Gudhi::persistence_matrix::Column_types)8,false,false,false>>::Matrix_column_tag,3u>,void,void,unsigned_long,false,(boost::intrusive::algo_types)5,void>
  ::
  clone_from<Gudhi::persistence_matrix::Intrusive_set_column<Column_mini_matrix<Chain_col_options<true,(Gudhi::persistence_matrix::Column_types)8,false,false,false>>>::New_cloner,Gudhi::persistence_matrix::Intrusive_set_column<Column_mini_matrix<Chain_col_options<true,(Gudhi::persistence_matrix::Column_types)8,false,false,false>>>::Delete_disposer>
            ((bstree_impl<boost::intrusive::bhtraits<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Chain_col_options<true,(Gudhi::persistence_matrix::Column_types)8,false,false,false>>>,boost::intrusive::rbtree_node_traits<void*,false>,(boost::intrusive::link_mode_type)1,Column_mini_matrix<Chain_col_options<true,(Gudhi::persistence_matrix::Column_types)8,false,false,false>>::Matrix_column_tag,3u>,void,void,unsigned_long,false,(boost::intrusive::algo_types)5,void>
              *)this_00,
             (bstree_impl<boost::intrusive::bhtraits<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)8,_false,_false,_false>_>_>,_boost::intrusive::rbtree_node_traits<void_*,_false>,_(boost::intrusive::link_mode_type)1,_Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)8,_false,_false,_false>_>::Matrix_column_tag,_3U>,_void,_void,_unsigned_long,_false,_(boost::intrusive::algo_types)5,_void>
              *)&column->column_,(New_cloner)colSettings,(Delete_disposer)this);
  return;
}

Assistant:

inline Intrusive_set_column<Master_matrix>::Intrusive_set_column(const Intrusive_set_column& column,
                                                                 Column_settings* colSettings)
    : RA_opt(),
      Dim_opt(static_cast<const Dim_opt&>(column)),
      Chain_opt(static_cast<const Chain_opt&>(column)),
      operators_(colSettings == nullptr ? column.operators_ : nullptr),
      entryPool_(colSettings == nullptr ? column.entryPool_ : &(colSettings->entryConstructor))
{
  static_assert(!Master_matrix::Option_list::has_row_access,
                "Simple copy constructor not available when row access option enabled. Please specify the new column "
                "index and the row container.");

  if constexpr (!Master_matrix::Option_list::is_z2) {
    if (colSettings != nullptr) operators_ = &(colSettings->operators);
  }

  column_.clone_from(column.column_, New_cloner(entryPool_), Delete_disposer(this));
}